

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::AssignOp::tokenize(AssignOp *this,GeneratorState *state,TokenStream *str)

{
  Token local_28;
  
  (*this->m_lvalueExpr->_vptr_Expression[3])();
  local_28.m_type = EQUAL;
  TokenStream::operator<<(str,&local_28);
  Token::~Token(&local_28);
  (*this->m_rvalueExpr->_vptr_Expression[3])(this->m_rvalueExpr,state,str);
  return;
}

Assistant:

void AssignOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_lvalueExpr->tokenize(state, str);
	str << Token::EQUAL;
	m_rvalueExpr->tokenize(state, str);
}